

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack12_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0xfff;
  out[1] = *in >> 0xc & 0xfff;
  puVar1 = out + 2;
  *puVar1 = *in >> 0x18;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0xf) << 8 | *puVar1;
  out[3] = *puVar2 >> 4 & 0xfff;
  out[4] = *puVar2 >> 0x10 & 0xfff;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 0x1c;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0xff) << 4 | *puVar1;
  out[6] = *puVar2 >> 8 & 0xfff;
  out[7] = *puVar2 >> 0x14;
  puVar1 = in + 3;
  out[8] = *puVar1 & 0xfff;
  out[9] = *puVar1 >> 0xc & 0xfff;
  puVar2 = out + 10;
  *puVar2 = *puVar1 >> 0x18;
  puVar1 = in + 4;
  *puVar2 = (*puVar1 & 0xf) << 8 | *puVar2;
  out[0xb] = *puVar1 >> 4 & 0xfff;
  out[0xc] = *puVar1 >> 0x10 & 0xfff;
  puVar2 = out + 0xd;
  *puVar2 = *puVar1 >> 0x1c;
  puVar1 = in + 5;
  *puVar2 = (*puVar1 & 0xff) << 4 | *puVar2;
  out[0xe] = *puVar1 >> 8 & 0xfff;
  out[0xf] = *puVar1 >> 0x14;
  puVar1 = in + 6;
  out[0x10] = *puVar1 & 0xfff;
  out[0x11] = *puVar1 >> 0xc & 0xfff;
  puVar2 = out + 0x12;
  *puVar2 = *puVar1 >> 0x18;
  puVar1 = in + 7;
  *puVar2 = (*puVar1 & 0xf) << 8 | *puVar2;
  out[0x13] = *puVar1 >> 4 & 0xfff;
  out[0x14] = *puVar1 >> 0x10 & 0xfff;
  puVar2 = out + 0x15;
  *puVar2 = *puVar1 >> 0x1c;
  puVar1 = in + 8;
  *puVar2 = (*puVar1 & 0xff) << 4 | *puVar2;
  out[0x16] = *puVar1 >> 8 & 0xfff;
  out[0x17] = *puVar1 >> 0x14;
  puVar1 = in + 9;
  out[0x18] = *puVar1 & 0xfff;
  out[0x19] = *puVar1 >> 0xc & 0xfff;
  puVar2 = out + 0x1a;
  *puVar2 = *puVar1 >> 0x18;
  puVar1 = in + 10;
  *puVar2 = (*puVar1 & 0xf) << 8 | *puVar2;
  out[0x1b] = *puVar1 >> 4 & 0xfff;
  out[0x1c] = *puVar1 >> 0x10 & 0xfff;
  puVar2 = out + 0x1d;
  *puVar2 = *puVar1 >> 0x1c;
  puVar1 = in + 0xb;
  *puVar2 = (*puVar1 & 0xff) << 4 | *puVar2;
  out[0x1e] = *puVar1 >> 8 & 0xfff;
  out[0x1f] = *puVar1 >> 0x14;
  return in + 0xc;
}

Assistant:

const uint32_t *__fastunpack12_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 12);
  out++;
  *out = ((*in) >> 12) % (1U << 12);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 4)) << (12 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 12);
  out++;
  *out = ((*in) >> 16) % (1U << 12);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 8)) << (12 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 12);
  out++;
  *out = ((*in) >> 20);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 12);
  out++;
  *out = ((*in) >> 12) % (1U << 12);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 4)) << (12 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 12);
  out++;
  *out = ((*in) >> 16) % (1U << 12);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 8)) << (12 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 12);
  out++;
  *out = ((*in) >> 20);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 12);
  out++;
  *out = ((*in) >> 12) % (1U << 12);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 4)) << (12 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 12);
  out++;
  *out = ((*in) >> 16) % (1U << 12);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 8)) << (12 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 12);
  out++;
  *out = ((*in) >> 20);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 12);
  out++;
  *out = ((*in) >> 12) % (1U << 12);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 4)) << (12 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 12);
  out++;
  *out = ((*in) >> 16) % (1U << 12);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 8)) << (12 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 12);
  out++;
  *out = ((*in) >> 20);
  ++in;
  out++;

  return in;
}